

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  CleanupParser(this);
  std::__cxx11::string::~string((string *)&this->ErrorString);
  std::__cxx11::string::~string((string *)&this->Result);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&(this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->OutputBuffer).super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&this->InputBuffer);
  return;
}

Assistant:

cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper()
{
  this->CleanupParser();
}